

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_MAC_Poly1305_Simd256.c
# Opt level: O3

void Hacl_MAC_Poly1305_Simd256_poly1305_finish
               (uint8_t *tag,uint8_t *key,Lib_IntVector_Intrinsics_vec256 *ctx)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  Lib_IntVector_Intrinsics_vec256 alVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  Lib_IntVector_Intrinsics_vec256 alVar9;
  Lib_IntVector_Intrinsics_vec256 alVar10;
  Lib_IntVector_Intrinsics_vec256 alVar11;
  Lib_IntVector_Intrinsics_vec256 alVar12;
  ulong uVar13;
  Lib_IntVector_Intrinsics_vec256 *acc;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  
  auVar19._8_8_ = 0x3ffffff;
  auVar19._0_8_ = 0x3ffffff;
  auVar19._16_8_ = 0x3ffffff;
  auVar19._24_8_ = 0x3ffffff;
  auVar16 = vpand_avx2((undefined1  [32])*ctx,auVar19);
  auVar14 = vpsrlq_avx2((undefined1  [32])*ctx,0x1a);
  auVar14 = vpaddq_avx2(auVar14,(undefined1  [32])ctx[1]);
  auVar17 = vpand_avx2(auVar14,auVar19);
  auVar14 = vpsrlq_avx2(auVar14,0x1a);
  auVar14 = vpaddq_avx2(auVar14,(undefined1  [32])ctx[2]);
  auVar18 = vpand_avx2(auVar14,auVar19);
  auVar14 = vpsrlq_avx2(auVar14,0x1a);
  auVar14 = vpaddq_avx2(auVar14,(undefined1  [32])ctx[3]);
  auVar5 = vpand_avx2(auVar14,auVar19);
  auVar14 = vpsrlq_avx2(auVar14,0x1a);
  auVar14 = vpaddq_avx2(auVar14,(undefined1  [32])ctx[4]);
  auVar6 = vpand_avx2(auVar14,auVar19);
  auVar14 = vpsrlq_avx2(auVar14,0x1a);
  auVar14 = vpblendd_avx2(auVar14,SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xaa);
  auVar15 = vpsllq_avx2(auVar14,2);
  auVar14 = vpaddq_avx2(auVar14,auVar16);
  auVar14 = vpaddq_avx2(auVar15,auVar14);
  auVar15 = vpand_avx2(auVar14,auVar19);
  auVar14 = vpsrlq_avx2(auVar14,0x1a);
  auVar14 = vpaddq_avx2(auVar14,auVar17);
  auVar7 = vpand_avx2(auVar14,auVar19);
  auVar14 = vpsrlq_avx2(auVar14,0x1a);
  auVar14 = vpaddq_avx2(auVar14,auVar18);
  auVar8 = vpand_avx2(auVar14,auVar19);
  auVar16 = vpsrlq_avx2(auVar14,0x1a);
  auVar16 = vpaddq_avx2(auVar16,auVar5);
  auVar5 = vpand_avx2(auVar16,auVar19);
  auVar17 = vpsrlq_avx2(auVar16,0x1a);
  auVar17 = vpaddq_avx2(auVar17,auVar6);
  auVar6 = vpand_avx2(auVar17,auVar19);
  auVar18 = vpsrlq_avx2(auVar17,0x1a);
  auVar19 = vpsllq_avx2(auVar18,2);
  auVar18 = vpor_avx2(auVar19,auVar18);
  auVar18 = vpaddq_avx2(auVar18,auVar15);
  auVar14 = vpand_avx2(auVar7,auVar14);
  auVar14 = vpand_avx2(auVar14,auVar16);
  auVar14 = vpand_avx2(auVar14,auVar17);
  auVar16._0_8_ = -(ulong)(auVar14._0_8_ == 0x3ffffff);
  auVar16._8_8_ = -(ulong)(auVar14._8_8_ == 0x3ffffff);
  auVar16._16_8_ = -(ulong)(auVar14._16_8_ == 0x3ffffff);
  auVar16._24_8_ = -(ulong)(auVar14._24_8_ == 0x3ffffff);
  auVar14._8_8_ = 0x3fffffa;
  auVar14._0_8_ = 0x3fffffa;
  auVar14._16_8_ = 0x3fffffa;
  auVar14._24_8_ = 0x3fffffa;
  auVar14 = vpcmpgtq_avx2(auVar18,auVar14);
  auVar14 = vpand_avx2(auVar16,auVar14);
  auVar17._8_8_ = 0xfffffffffc000005;
  auVar17._0_8_ = 0xfffffffffc000005;
  auVar17._16_8_ = 0xfffffffffc000005;
  auVar17._24_8_ = 0xfffffffffc000005;
  auVar16 = vpsrlq_avx2(auVar14,0x26);
  auVar14 = vpand_avx2(auVar14,auVar17);
  alVar4 = (Lib_IntVector_Intrinsics_vec256)vpaddq_avx2(auVar14,auVar18);
  alVar9 = (Lib_IntVector_Intrinsics_vec256)vpsubq_avx2(auVar7,auVar16);
  alVar10 = (Lib_IntVector_Intrinsics_vec256)vpsubq_avx2(auVar8,auVar16);
  alVar11 = (Lib_IntVector_Intrinsics_vec256)vpsubq_avx2(auVar5,auVar16);
  alVar12 = (Lib_IntVector_Intrinsics_vec256)vpsubq_avx2(auVar6,auVar16);
  *ctx = alVar4;
  ctx[1] = alVar9;
  ctx[2] = alVar10;
  ctx[3] = alVar11;
  ctx[4] = alVar12;
  uVar13 = alVar10[0] << 0x34 | alVar9[0] << 0x1a | alVar4[0];
  uVar2 = *(ulong *)(key + 0x10);
  uVar1 = uVar13 + uVar2;
  lVar3 = *(long *)(key + 0x18);
  *(ulong *)tag = uVar1;
  *(ulong *)(tag + 8) =
       ((alVar12[0] << 0x28 | alVar11[0] << 0xe | alVar10[0] >> 0xc) + lVar3) -
       ((long)((uVar13 ^ uVar2 | uVar1 ^ uVar2) ^ uVar1) >> 0x3f);
  return;
}

Assistant:

void
Hacl_MAC_Poly1305_Simd256_poly1305_finish(
  uint8_t *tag,
  uint8_t *key,
  Lib_IntVector_Intrinsics_vec256 *ctx
)
{
  Lib_IntVector_Intrinsics_vec256 *acc = ctx;
  uint8_t *ks = key + 16U;
  Lib_IntVector_Intrinsics_vec256 f0 = acc[0U];
  Lib_IntVector_Intrinsics_vec256 f13 = acc[1U];
  Lib_IntVector_Intrinsics_vec256 f23 = acc[2U];
  Lib_IntVector_Intrinsics_vec256 f33 = acc[3U];
  Lib_IntVector_Intrinsics_vec256 f40 = acc[4U];
  Lib_IntVector_Intrinsics_vec256
  l0 = Lib_IntVector_Intrinsics_vec256_add64(f0, Lib_IntVector_Intrinsics_vec256_zero);
  Lib_IntVector_Intrinsics_vec256
  tmp00 =
    Lib_IntVector_Intrinsics_vec256_and(l0,
      Lib_IntVector_Intrinsics_vec256_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec256 c00 = Lib_IntVector_Intrinsics_vec256_shift_right64(l0, 26U);
  Lib_IntVector_Intrinsics_vec256 l1 = Lib_IntVector_Intrinsics_vec256_add64(f13, c00);
  Lib_IntVector_Intrinsics_vec256
  tmp10 =
    Lib_IntVector_Intrinsics_vec256_and(l1,
      Lib_IntVector_Intrinsics_vec256_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec256 c10 = Lib_IntVector_Intrinsics_vec256_shift_right64(l1, 26U);
  Lib_IntVector_Intrinsics_vec256 l2 = Lib_IntVector_Intrinsics_vec256_add64(f23, c10);
  Lib_IntVector_Intrinsics_vec256
  tmp20 =
    Lib_IntVector_Intrinsics_vec256_and(l2,
      Lib_IntVector_Intrinsics_vec256_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec256 c20 = Lib_IntVector_Intrinsics_vec256_shift_right64(l2, 26U);
  Lib_IntVector_Intrinsics_vec256 l3 = Lib_IntVector_Intrinsics_vec256_add64(f33, c20);
  Lib_IntVector_Intrinsics_vec256
  tmp30 =
    Lib_IntVector_Intrinsics_vec256_and(l3,
      Lib_IntVector_Intrinsics_vec256_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec256 c30 = Lib_IntVector_Intrinsics_vec256_shift_right64(l3, 26U);
  Lib_IntVector_Intrinsics_vec256 l4 = Lib_IntVector_Intrinsics_vec256_add64(f40, c30);
  Lib_IntVector_Intrinsics_vec256
  tmp40 =
    Lib_IntVector_Intrinsics_vec256_and(l4,
      Lib_IntVector_Intrinsics_vec256_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec256 c40 = Lib_IntVector_Intrinsics_vec256_shift_right64(l4, 26U);
  Lib_IntVector_Intrinsics_vec256
  f010 =
    Lib_IntVector_Intrinsics_vec256_add64(tmp00,
      Lib_IntVector_Intrinsics_vec256_smul64(c40, 5ULL));
  Lib_IntVector_Intrinsics_vec256 f110 = tmp10;
  Lib_IntVector_Intrinsics_vec256 f210 = tmp20;
  Lib_IntVector_Intrinsics_vec256 f310 = tmp30;
  Lib_IntVector_Intrinsics_vec256 f410 = tmp40;
  Lib_IntVector_Intrinsics_vec256
  l = Lib_IntVector_Intrinsics_vec256_add64(f010, Lib_IntVector_Intrinsics_vec256_zero);
  Lib_IntVector_Intrinsics_vec256
  tmp0 =
    Lib_IntVector_Intrinsics_vec256_and(l,
      Lib_IntVector_Intrinsics_vec256_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec256 c0 = Lib_IntVector_Intrinsics_vec256_shift_right64(l, 26U);
  Lib_IntVector_Intrinsics_vec256 l5 = Lib_IntVector_Intrinsics_vec256_add64(f110, c0);
  Lib_IntVector_Intrinsics_vec256
  tmp1 =
    Lib_IntVector_Intrinsics_vec256_and(l5,
      Lib_IntVector_Intrinsics_vec256_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec256 c1 = Lib_IntVector_Intrinsics_vec256_shift_right64(l5, 26U);
  Lib_IntVector_Intrinsics_vec256 l6 = Lib_IntVector_Intrinsics_vec256_add64(f210, c1);
  Lib_IntVector_Intrinsics_vec256
  tmp2 =
    Lib_IntVector_Intrinsics_vec256_and(l6,
      Lib_IntVector_Intrinsics_vec256_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec256 c2 = Lib_IntVector_Intrinsics_vec256_shift_right64(l6, 26U);
  Lib_IntVector_Intrinsics_vec256 l7 = Lib_IntVector_Intrinsics_vec256_add64(f310, c2);
  Lib_IntVector_Intrinsics_vec256
  tmp3 =
    Lib_IntVector_Intrinsics_vec256_and(l7,
      Lib_IntVector_Intrinsics_vec256_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec256 c3 = Lib_IntVector_Intrinsics_vec256_shift_right64(l7, 26U);
  Lib_IntVector_Intrinsics_vec256 l8 = Lib_IntVector_Intrinsics_vec256_add64(f410, c3);
  Lib_IntVector_Intrinsics_vec256
  tmp4 =
    Lib_IntVector_Intrinsics_vec256_and(l8,
      Lib_IntVector_Intrinsics_vec256_load64(0x3ffffffULL));
  Lib_IntVector_Intrinsics_vec256 c4 = Lib_IntVector_Intrinsics_vec256_shift_right64(l8, 26U);
  Lib_IntVector_Intrinsics_vec256
  f02 =
    Lib_IntVector_Intrinsics_vec256_add64(tmp0,
      Lib_IntVector_Intrinsics_vec256_smul64(c4, 5ULL));
  Lib_IntVector_Intrinsics_vec256 f12 = tmp1;
  Lib_IntVector_Intrinsics_vec256 f22 = tmp2;
  Lib_IntVector_Intrinsics_vec256 f32 = tmp3;
  Lib_IntVector_Intrinsics_vec256 f42 = tmp4;
  Lib_IntVector_Intrinsics_vec256 mh = Lib_IntVector_Intrinsics_vec256_load64(0x3ffffffULL);
  Lib_IntVector_Intrinsics_vec256 ml = Lib_IntVector_Intrinsics_vec256_load64(0x3fffffbULL);
  Lib_IntVector_Intrinsics_vec256 mask = Lib_IntVector_Intrinsics_vec256_eq64(f42, mh);
  Lib_IntVector_Intrinsics_vec256
  mask1 =
    Lib_IntVector_Intrinsics_vec256_and(mask,
      Lib_IntVector_Intrinsics_vec256_eq64(f32, mh));
  Lib_IntVector_Intrinsics_vec256
  mask2 =
    Lib_IntVector_Intrinsics_vec256_and(mask1,
      Lib_IntVector_Intrinsics_vec256_eq64(f22, mh));
  Lib_IntVector_Intrinsics_vec256
  mask3 =
    Lib_IntVector_Intrinsics_vec256_and(mask2,
      Lib_IntVector_Intrinsics_vec256_eq64(f12, mh));
  Lib_IntVector_Intrinsics_vec256
  mask4 =
    Lib_IntVector_Intrinsics_vec256_and(mask3,
      Lib_IntVector_Intrinsics_vec256_lognot(Lib_IntVector_Intrinsics_vec256_gt64(ml, f02)));
  Lib_IntVector_Intrinsics_vec256 ph = Lib_IntVector_Intrinsics_vec256_and(mask4, mh);
  Lib_IntVector_Intrinsics_vec256 pl = Lib_IntVector_Intrinsics_vec256_and(mask4, ml);
  Lib_IntVector_Intrinsics_vec256 o0 = Lib_IntVector_Intrinsics_vec256_sub64(f02, pl);
  Lib_IntVector_Intrinsics_vec256 o1 = Lib_IntVector_Intrinsics_vec256_sub64(f12, ph);
  Lib_IntVector_Intrinsics_vec256 o2 = Lib_IntVector_Intrinsics_vec256_sub64(f22, ph);
  Lib_IntVector_Intrinsics_vec256 o3 = Lib_IntVector_Intrinsics_vec256_sub64(f32, ph);
  Lib_IntVector_Intrinsics_vec256 o4 = Lib_IntVector_Intrinsics_vec256_sub64(f42, ph);
  Lib_IntVector_Intrinsics_vec256 f011 = o0;
  Lib_IntVector_Intrinsics_vec256 f111 = o1;
  Lib_IntVector_Intrinsics_vec256 f211 = o2;
  Lib_IntVector_Intrinsics_vec256 f311 = o3;
  Lib_IntVector_Intrinsics_vec256 f411 = o4;
  acc[0U] = f011;
  acc[1U] = f111;
  acc[2U] = f211;
  acc[3U] = f311;
  acc[4U] = f411;
  Lib_IntVector_Intrinsics_vec256 f00 = acc[0U];
  Lib_IntVector_Intrinsics_vec256 f1 = acc[1U];
  Lib_IntVector_Intrinsics_vec256 f2 = acc[2U];
  Lib_IntVector_Intrinsics_vec256 f3 = acc[3U];
  Lib_IntVector_Intrinsics_vec256 f4 = acc[4U];
  uint64_t f01 = Lib_IntVector_Intrinsics_vec256_extract64(f00, 0U);
  uint64_t f112 = Lib_IntVector_Intrinsics_vec256_extract64(f1, 0U);
  uint64_t f212 = Lib_IntVector_Intrinsics_vec256_extract64(f2, 0U);
  uint64_t f312 = Lib_IntVector_Intrinsics_vec256_extract64(f3, 0U);
  uint64_t f41 = Lib_IntVector_Intrinsics_vec256_extract64(f4, 0U);
  uint64_t lo = (f01 | f112 << 26U) | f212 << 52U;
  uint64_t hi = (f212 >> 12U | f312 << 14U) | f41 << 40U;
  uint64_t f10 = lo;
  uint64_t f11 = hi;
  uint64_t u0 = load64_le(ks);
  uint64_t lo0 = u0;
  uint64_t u = load64_le(ks + 8U);
  uint64_t hi0 = u;
  uint64_t f20 = lo0;
  uint64_t f21 = hi0;
  uint64_t r0 = f10 + f20;
  uint64_t r1 = f11 + f21;
  uint64_t c = (r0 ^ ((r0 ^ f20) | ((r0 - f20) ^ f20))) >> 63U;
  uint64_t r11 = r1 + c;
  uint64_t f30 = r0;
  uint64_t f31 = r11;
  store64_le(tag, f30);
  store64_le(tag + 8U, f31);
}